

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_reverse(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  size_t l;
  luaL_Buffer b;
  size_t local_440;
  luaL_Buffer local_438;
  
  pcVar1 = luaL_checklstring(L,1,&local_440);
  pcVar2 = luaL_buffinitsize(L,&local_438,local_440);
  if (local_440 == 0) {
    local_440 = 0;
  }
  else {
    uVar3 = 0;
    do {
      pcVar1 = pcVar1 + -1;
      pcVar2[uVar3] = pcVar1[local_440];
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_440);
  }
  luaL_pushresultsize(&local_438,local_440);
  return 1;
}

Assistant:

static int str_reverse (lua_State *L) {
  size_t l, i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  char *p = luaL_buffinitsize(L, &b, l);
  for (i = 0; i < l; i++)
    p[i] = s[l - i - 1];
  luaL_pushresultsize(&b, l);
  return 1;
}